

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  pthread_mutex_t *__mutex;
  DescriptorPool *pool_00;
  int iVar1;
  const_iterator cVar2;
  Type *pTVar3;
  Type unaff_EBP;
  anon_union_8_8_13f84498_for_Symbol_2 unaff_R12;
  bool bVar4;
  Symbol SVar5;
  MutexLockMaybe lock;
  MutexLockMaybe local_48;
  pointer local_40;
  string *local_38;
  
  __mutex = (pthread_mutex_t *)pool->mutex_;
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    local_38 = name;
    if ((this->known_bad_files_)._M_h._M_element_count == 0 &&
        (this->known_bad_symbols_)._M_h._M_element_count == 0) {
      local_40 = (name->_M_dataplus)._M_p;
      cVar2 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->symbols_by_name_)._M_h,&local_40);
      pTVar3 = (Type *)((long)cVar2.
                              super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                              ._M_cur + 0x10);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
          _M_cur == (__node_type *)0x0) {
        pTVar3 = &(anonymous_namespace)::kNullSymbol;
      }
      unaff_R12 = (anon_union_8_8_13f84498_for_Symbol_2)
                  ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar3 + 2))->descriptor;
      unaff_EBP = *pTVar3;
      bVar4 = unaff_EBP == NULL_SYMBOL;
    }
    else {
      bVar4 = true;
    }
    pthread_mutex_unlock(__mutex);
    name = local_38;
    if (!bVar4) goto LAB_002bcc4b;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&local_48,pool->mutex_);
  if (pool->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_files_)._M_h);
  }
  local_40 = (name->_M_dataplus)._M_p;
  cVar2 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->symbols_by_name_)._M_h,&local_40);
  pTVar3 = (Type *)((long)cVar2.
                          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                          ._M_cur + 0x10);
  if (cVar2.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    pTVar3 = &(anonymous_namespace)::kNullSymbol;
  }
  unaff_R12 = (anon_union_8_8_13f84498_for_Symbol_2)
              ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar3 + 2))->descriptor;
  unaff_EBP = *pTVar3;
  if ((unaff_EBP == NULL_SYMBOL) && (pool_00 = pool->underlay_, pool_00 != (DescriptorPool *)0x0)) {
    SVar5 = FindByNameHelper((pool_00->tables_)._M_t.
                             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                             ._M_head_impl,pool_00,name);
    unaff_R12 = SVar5.field_1;
    unaff_EBP = SVar5.type;
  }
  if ((unaff_EBP == NULL_SYMBOL) && (bVar4 = TryFindSymbolInFallbackDatabase(pool,name), bVar4)) {
    local_40 = (name->_M_dataplus)._M_p;
    cVar2 = std::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->symbols_by_name_)._M_h,&local_40);
    pTVar3 = (Type *)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                            ._M_cur + 0x10);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
        _M_cur == (__node_type *)0x0) {
      pTVar3 = &(anonymous_namespace)::kNullSymbol;
    }
    unaff_R12 = (anon_union_8_8_13f84498_for_Symbol_2)
                ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar3 + 2))->descriptor;
    unaff_EBP = *pTVar3;
  }
  if ((pthread_mutex_t *)local_48.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_48.mu_);
  }
LAB_002bcc4b:
  SVar5._4_4_ = 0;
  SVar5.type = unaff_EBP;
  SVar5.field_1.descriptor = unaff_R12.descriptor;
  return SVar5;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                const std::string& name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}